

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O2

size_t __thiscall flow::ConstantPool::makeIPAddress(ConstantPool *this,IPAddress *value)

{
  size_t sVar1;
  
  sVar1 = ensureValue<flow::util::IPAddress,flow::util::IPAddress>(&this->ipaddrs_,value);
  return sVar1;
}

Assistant:

size_t ConstantPool::makeIPAddress(const util::IPAddress& value) {
  return ensureValue(ipaddrs_, value);
}